

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  TemplateDictionary *this_local;
  
  if (this->template_global_dict_owner_ != (TemplateDictionary *)0x0) {
    LazyCreateTemplateGlobalDict(this);
    SetValueWithoutCopy(this->template_global_dict_owner_->template_global_dict_,variable,value);
    return;
  }
  __assert_fail("template_global_dict_owner_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x200,
                "void ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy(const TemplateString, const TemplateString)"
               );
}

Assistant:

void TemplateDictionary::SetTemplateGlobalValueWithoutCopy(
    const TemplateString variable,
    const TemplateString value) {
  assert(template_global_dict_owner_ != NULL);
  LazyCreateTemplateGlobalDict();
  // Don't memdup value - the caller will manage memory.
  template_global_dict_owner_->template_global_dict_->
      SetValueWithoutCopy(variable, value);
}